

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(Gazetteer *a,Gazetteer *b)

{
  string *psVar1;
  string *psVar2;
  size_t sVar3;
  StringVector *a_00;
  bool bVar4;
  int iVar5;
  StringVector *b_00;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  psVar1 = (a->language_).ptr_;
  psVar2 = (b->language_).ptr_;
  sVar3 = psVar1->_M_string_length;
  if ((sVar3 == psVar2->_M_string_length) &&
     (((sVar3 == 0 ||
       (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0)) &&
      (a->_oneof_case_[0] == b->_oneof_case_[0])))) {
    if (a->_oneof_case_[0] == 200) {
      a_00 = (a->ClassLabels_).stringclasslabels_;
      if (b->_oneof_case_[0] == 200) {
        b_00 = (b->ClassLabels_).stringclasslabels_;
      }
      else {
        b_00 = StringVector::default_instance();
      }
      bVar4 = vectorsEqual<CoreML::Specification::StringVector>(a_00,b_00);
      if (!bVar4) {
        return false;
      }
    }
    psVar1 = (a->modelparameterdata_).ptr_;
    sVar3 = psVar1->_M_string_length;
    psVar2 = (b->modelparameterdata_).ptr_;
    if ((sVar3 == psVar2->_M_string_length) &&
       ((sVar3 == 0 ||
        (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline ::google::protobuf::uint32 Gazetteer::revision() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CoreMLModels.Gazetteer.revision)
  return revision_;
}